

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegionSection *
address_space_translate_internal
          (AddressSpaceDispatch *d,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool resolve_subpage)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 a [16];
  _Bool _Var3;
  undefined8 in_RAX;
  MemoryRegionSection *section;
  undefined8 unaff_RBX;
  ulong uVar4;
  ulong uVar5;
  
  section = d->mru_section;
  if (((section == (MemoryRegionSection *)0x0) || (section == (d->map).sections)) ||
     (_Var3 = section_covers_addr(section,addr), !_Var3)) {
    section = phys_page_find(d,addr);
    d->mru_section = section;
  }
  if ((resolve_subpage) && (section->mr->subpage == true)) {
    section = (d->map).sections +
              *(ushort *)((long)&section->mr[1].ops + (ulong)((uint)addr & 0x3fff) * 2);
  }
  uVar5 = addr - section->offset_within_address_space;
  *xlat = section->offset_within_region + uVar5;
  if (section->mr->ram == true) {
    uVar1 = (ulong)section->size;
    uVar4 = uVar1 - uVar5;
    uVar2 = *plen;
    if ((long)(*(long *)((long)&section->size + 8) - (ulong)(uVar1 < uVar5)) <
        (long)(ulong)(uVar4 < uVar2)) {
      uVar2 = uVar4;
    }
    a._8_8_ = unaff_RBX;
    a._0_8_ = in_RAX;
    int128_get64((Int128)a);
    *plen = uVar2;
  }
  return section;
}

Assistant:

static MemoryRegionSection *
address_space_translate_internal(AddressSpaceDispatch *d, hwaddr addr, hwaddr *xlat,
                                 hwaddr *plen, bool resolve_subpage)
{
    MemoryRegionSection *section;
    MemoryRegion *mr;
    Int128 diff;

    section = address_space_lookup_region(d, addr, resolve_subpage);
    /* Compute offset within MemoryRegionSection */
    addr -= section->offset_within_address_space;

    /* Compute offset within MemoryRegion */
    *xlat = addr + section->offset_within_region;

    mr = section->mr;

    /* MMIO registers can be expected to perform full-width accesses based only
     * on their address, without considering adjacent registers that could
     * decode to completely different MemoryRegions.  When such registers
     * exist (e.g. I/O ports 0xcf8 and 0xcf9 on most PC chipsets), MMIO
     * regions overlap wildly.  For this reason we cannot clamp the accesses
     * here.
     *
     * If the length is small (as is the case for address_space_ldl/stl),
     * everything works fine.  If the incoming length is large, however,
     * the caller really has to do the clamping through memory_access_size.
     */
    if (memory_region_is_ram(mr)) {
        diff = int128_sub(section->size, int128_make64(addr));
        *plen = int128_get64(int128_min(diff, int128_make64(*plen)));
    }
    return section;
}